

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O0

string * __thiscall
cmFilePathChecksum::getPart
          (string *__return_storage_ptr__,cmFilePathChecksum *this,string *filePath,size_t length)

{
  string local_48;
  size_t local_28;
  size_t length_local;
  string *filePath_local;
  cmFilePathChecksum *this_local;
  
  local_28 = length;
  length_local = (size_t)filePath;
  filePath_local = (string *)this;
  this_local = (cmFilePathChecksum *)__return_storage_ptr__;
  get(&local_48,this,filePath);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFilePathChecksum::getPart(std::string const& filePath,
                                        size_t length) const
{
  return get(filePath).substr(0, length);
}